

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_32x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  unkuint9 Var15;
  undefined1 auVar16 [11];
  undefined1 auVar17 [13];
  undefined1 auVar18 [15];
  unkuint9 Var19;
  undefined1 auVar20 [11];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  int y_mask;
  uint uVar25;
  uint8_t *puVar26;
  short sVar27;
  short sVar29;
  undefined1 auVar28 [16];
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  ushort uVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  undefined1 auVar46 [16];
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  undefined1 auVar47 [16];
  short sVar53;
  ushort uVar54;
  short sVar55;
  short sVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar62;
  undefined1 auVar56 [16];
  ushort uVar61;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  undefined1 auVar57 [16];
  ushort uVar66;
  ushort uVar67;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  undefined1 auVar68 [16];
  ushort uVar81;
  ushort uVar82;
  short sVar83;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  undefined1 auVar84 [16];
  short sVar92;
  undefined1 auVar85 [16];
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  
  auVar85 = _DAT_00468950;
  auVar28 = pshuflw(ZEXT116(left_column[0x1f]),ZEXT116(left_column[0x1f]),0);
  auVar47 = *(undefined1 (*) [16])top_row;
  auVar57 = *(undefined1 (*) [16])(top_row + 0x10);
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar47._0_13_;
  auVar2[0xe] = auVar47[7];
  auVar4[0xc] = auVar47[6];
  auVar4._0_12_ = auVar47._0_12_;
  auVar4._13_2_ = auVar2._13_2_;
  auVar6[0xb] = 0;
  auVar6._0_11_ = auVar47._0_11_;
  auVar6._12_3_ = auVar4._12_3_;
  auVar8[10] = auVar47[5];
  auVar8._0_10_ = auVar47._0_10_;
  auVar8._11_4_ = auVar6._11_4_;
  auVar10[9] = 0;
  auVar10._0_9_ = auVar47._0_9_;
  auVar10._10_5_ = auVar8._10_5_;
  auVar12[8] = auVar47[4];
  auVar12._0_8_ = auVar47._0_8_;
  auVar12._9_6_ = auVar10._9_6_;
  auVar14._7_8_ = 0;
  auVar14._0_7_ = auVar12._8_7_;
  Var15 = CONCAT81(SUB158(auVar14 << 0x40,7),auVar47[3]);
  auVar21._9_6_ = 0;
  auVar21._0_9_ = Var15;
  auVar16._1_10_ = SUB1510(auVar21 << 0x30,5);
  auVar16[0] = auVar47[2];
  auVar22._11_4_ = 0;
  auVar22._0_11_ = auVar16;
  auVar17._1_12_ = SUB1512(auVar22 << 0x20,3);
  auVar17[0] = auVar47[1];
  uVar32 = (ushort)auVar47[0];
  uVar30 = (ushort)auVar47[8];
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar57._0_13_;
  auVar1[0xe] = auVar57[7];
  auVar3[0xc] = auVar57[6];
  auVar3._0_12_ = auVar57._0_12_;
  auVar3._13_2_ = auVar1._13_2_;
  auVar5[0xb] = 0;
  auVar5._0_11_ = auVar57._0_11_;
  auVar5._12_3_ = auVar3._12_3_;
  auVar7[10] = auVar57[5];
  auVar7._0_10_ = auVar57._0_10_;
  auVar7._11_4_ = auVar5._11_4_;
  auVar9[9] = 0;
  auVar9._0_9_ = auVar57._0_9_;
  auVar9._10_5_ = auVar7._10_5_;
  auVar11[8] = auVar57[4];
  auVar11._0_8_ = auVar57._0_8_;
  auVar11._9_6_ = auVar9._9_6_;
  auVar18._7_8_ = 0;
  auVar18._0_7_ = auVar11._8_7_;
  Var19 = CONCAT81(SUB158(auVar18 << 0x40,7),auVar57[3]);
  auVar23._9_6_ = 0;
  auVar23._0_9_ = Var19;
  auVar20._1_10_ = SUB1510(auVar23 << 0x30,5);
  auVar20[0] = auVar57[2];
  auVar24._11_4_ = 0;
  auVar24._0_11_ = auVar20;
  auVar13[2] = auVar57[1];
  auVar13._0_2_ = auVar57._0_2_;
  auVar13._3_12_ = SUB1512(auVar24 << 0x20,3);
  uVar39 = auVar57._0_2_ & 0xff;
  uVar31 = (ushort)auVar57[8];
  sVar27 = auVar28._0_2_;
  sVar29 = auVar28._2_2_;
  auVar46._2_2_ = sVar29 * 0x10;
  auVar46._0_2_ = sVar27;
  auVar46._4_2_ = sVar27 * 0x1f;
  auVar46._6_2_ = sVar29 * 0x2e;
  auVar46._8_2_ = sVar27 * 0x3c;
  auVar46._10_2_ = sVar29 * 0x4a;
  auVar46._12_2_ = sVar27 * 0x57;
  auVar46._14_2_ = sVar29 * 99;
  auVar28._0_2_ = sVar27 * 0xbe;
  auVar28._2_2_ = sVar29 * 0xc5;
  auVar28._4_2_ = sVar27 * 0xcc;
  auVar28._6_2_ = sVar29 * 0xd3;
  auVar28._8_2_ = sVar27 * 0xd9;
  auVar28._10_2_ = sVar29 * 0xde;
  auVar28._12_2_ = sVar27 * 0xe3;
  auVar28._14_2_ = sVar29 * 0xe7;
  puVar26 = dst + 0x10;
  uVar25 = 0x1000100;
  while( true ) {
    auVar56 = _DAT_00468970;
    sVar33 = auVar17._0_2_;
    sVar34 = auVar16._0_2_;
    sVar35 = (short)Var15;
    sVar36 = auVar12._8_2_;
    sVar37 = auVar8._10_2_;
    sVar38 = auVar4._12_2_;
    uVar67 = auVar2._13_2_ >> 8;
    uVar94 = (ushort)auVar47[9];
    uVar96 = (ushort)auVar47[10];
    uVar98 = (ushort)auVar47[0xb];
    uVar100 = (ushort)auVar47[0xc];
    uVar102 = (ushort)auVar47[0xd];
    uVar106 = (ushort)auVar47[0xe];
    uVar110 = (ushort)auVar47[0xf];
    sVar40 = auVar13._2_2_;
    sVar41 = auVar20._0_2_;
    sVar42 = (short)Var19;
    sVar43 = auVar11._8_2_;
    sVar44 = auVar7._10_2_;
    sVar45 = auVar3._12_2_;
    uVar54 = auVar1._13_2_ >> 8;
    uVar59 = (ushort)auVar57[9];
    uVar60 = (ushort)auVar57[10];
    uVar61 = (ushort)auVar57[0xb];
    uVar62 = (ushort)auVar57[0xc];
    uVar63 = (ushort)auVar57[0xd];
    uVar64 = (ushort)auVar57[0xe];
    uVar65 = (ushort)auVar57[0xf];
    if (0xf0e0f0e < uVar25) break;
    auVar68._4_4_ = uVar25;
    auVar68._0_4_ = uVar25;
    auVar68._8_4_ = uVar25;
    auVar68._12_4_ = uVar25;
    auVar56 = pshufb(auVar85,auVar68);
    auVar84 = pshufb(auVar46,auVar68);
    sVar48 = auVar56._0_2_;
    sVar49 = auVar56._2_2_;
    sVar50 = auVar56._4_2_;
    sVar51 = auVar56._6_2_;
    sVar52 = auVar56._8_2_;
    sVar53 = auVar56._10_2_;
    sVar55 = auVar56._12_2_;
    sVar58 = auVar56._14_2_;
    sVar83 = auVar84._0_2_ + 0x80;
    sVar86 = auVar84._2_2_ + 0x80;
    sVar87 = auVar84._4_2_ + 0x80;
    sVar88 = auVar84._6_2_ + 0x80;
    sVar89 = auVar84._8_2_ + 0x80;
    sVar90 = auVar84._10_2_ + 0x80;
    sVar91 = auVar84._12_2_ + 0x80;
    sVar92 = auVar84._14_2_ + 0x80;
    uVar66 = sVar48 * uVar32 + sVar83;
    uVar69 = sVar49 * sVar33 + sVar86;
    uVar71 = sVar50 * sVar34 + sVar87;
    uVar73 = sVar51 * sVar35 + sVar88;
    uVar75 = sVar52 * sVar36 + sVar89;
    uVar77 = sVar53 * sVar37 + sVar90;
    uVar79 = sVar55 * sVar38 + sVar91;
    uVar81 = sVar58 * uVar67 + sVar92;
    uVar67 = uVar66 >> 8;
    uVar70 = uVar69 >> 8;
    uVar72 = uVar71 >> 8;
    uVar74 = uVar73 >> 8;
    uVar76 = uVar75 >> 8;
    uVar78 = uVar77 >> 8;
    uVar80 = uVar79 >> 8;
    uVar82 = uVar81 >> 8;
    uVar93 = sVar48 * uVar30 + sVar83;
    uVar95 = sVar49 * uVar94 + sVar86;
    uVar97 = sVar50 * uVar96 + sVar87;
    uVar99 = sVar51 * uVar98 + sVar88;
    uVar101 = sVar52 * uVar100 + sVar89;
    uVar105 = sVar53 * uVar102 + sVar90;
    uVar109 = sVar55 * uVar106 + sVar91;
    uVar113 = sVar58 * uVar110 + sVar92;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar98 = uVar97 >> 8;
    uVar100 = uVar99 >> 8;
    uVar102 = uVar101 >> 8;
    uVar106 = uVar105 >> 8;
    uVar110 = uVar109 >> 8;
    uVar114 = uVar113 >> 8;
    puVar26[-0x10] = (uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67);
    puVar26[-0xf] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
    puVar26[-0xe] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
    puVar26[-0xd] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
    puVar26[-0xc] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    puVar26[-0xb] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar26[-10] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    puVar26[-9] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar82);
    puVar26[-8] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar26[-7] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar26[-6] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
    puVar26[-5] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar26[-4] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar26[-3] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar26[-2] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar26[-1] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    uVar66 = sVar48 * uVar39 + sVar83;
    uVar70 = sVar49 * sVar40 + sVar86;
    uVar72 = sVar50 * sVar41 + sVar87;
    uVar74 = sVar51 * sVar42 + sVar88;
    uVar76 = sVar52 * sVar43 + sVar89;
    uVar78 = sVar53 * sVar44 + sVar90;
    uVar80 = sVar55 * sVar45 + sVar91;
    uVar82 = sVar58 * uVar54 + sVar92;
    uVar69 = uVar66 >> 8;
    uVar71 = uVar70 >> 8;
    uVar73 = uVar72 >> 8;
    uVar75 = uVar74 >> 8;
    uVar77 = uVar76 >> 8;
    uVar79 = uVar78 >> 8;
    uVar81 = uVar80 >> 8;
    uVar93 = uVar82 >> 8;
    uVar67 = sVar48 * uVar31 + sVar83;
    uVar94 = sVar49 * uVar59 + sVar86;
    uVar98 = sVar50 * uVar60 + sVar87;
    uVar102 = sVar51 * uVar61 + sVar88;
    uVar110 = sVar52 * uVar62 + sVar89;
    uVar60 = sVar53 * uVar63 + sVar90;
    uVar62 = sVar55 * uVar64 + sVar91;
    uVar64 = sVar58 * uVar65 + sVar92;
    uVar54 = uVar67 >> 8;
    uVar96 = uVar94 >> 8;
    uVar100 = uVar98 >> 8;
    uVar106 = uVar102 >> 8;
    uVar59 = uVar110 >> 8;
    uVar61 = uVar60 >> 8;
    uVar63 = uVar62 >> 8;
    uVar65 = uVar64 >> 8;
    *puVar26 = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar69);
    puVar26[1] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
    puVar26[2] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
    puVar26[3] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar26[4] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    puVar26[5] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    puVar26[6] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar26[7] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar93);
    puVar26[8] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar54);
    puVar26[9] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar96);
    puVar26[10] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar98 >> 8) - (0xff < uVar100);
    puVar26[0xb] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar106);
    puVar26[0xc] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar110 >> 8) - (0xff < uVar59);
    puVar26[0xd] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
    puVar26[0xe] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar63);
    puVar26[0xf] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65);
    uVar25 = uVar25 + 0x2020202;
    puVar26 = puVar26 + stride;
  }
  auVar47._0_2_ = sVar27 * 0x6f;
  auVar47._2_2_ = sVar29 * 0x7b;
  auVar47._4_2_ = sVar27 * 0x86;
  auVar47._6_2_ = sVar29 * 0x91;
  auVar47._8_2_ = sVar27 * 0x9b;
  auVar47._10_2_ = sVar29 * 0xa4;
  auVar47._12_2_ = sVar27 * 0xad;
  auVar47._14_2_ = sVar29 * 0xb6;
  for (uVar25 = 0x1000100; auVar57 = _DAT_00468990, uVar25 < 0xf0e0f0f; uVar25 = uVar25 + 0x2020202)
  {
    auVar84._4_4_ = uVar25;
    auVar84._0_4_ = uVar25;
    auVar84._8_4_ = uVar25;
    auVar84._12_4_ = uVar25;
    auVar57 = pshufb(auVar56,auVar84);
    auVar85 = pshufb(auVar47,auVar84);
    sVar48 = auVar57._0_2_;
    sVar49 = auVar57._2_2_;
    sVar50 = auVar57._4_2_;
    sVar51 = auVar57._6_2_;
    sVar52 = auVar57._8_2_;
    sVar53 = auVar57._10_2_;
    sVar55 = auVar57._12_2_;
    sVar58 = auVar57._14_2_;
    sVar83 = auVar85._0_2_ + 0x80;
    sVar86 = auVar85._2_2_ + 0x80;
    sVar87 = auVar85._4_2_ + 0x80;
    sVar88 = auVar85._6_2_ + 0x80;
    sVar89 = auVar85._8_2_ + 0x80;
    sVar90 = auVar85._10_2_ + 0x80;
    sVar91 = auVar85._12_2_ + 0x80;
    sVar92 = auVar85._14_2_ + 0x80;
    uVar66 = sVar48 * uVar32 + sVar83;
    uVar70 = sVar49 * sVar33 + sVar86;
    uVar72 = sVar50 * sVar34 + sVar87;
    uVar74 = sVar51 * sVar35 + sVar88;
    uVar76 = sVar52 * sVar36 + sVar89;
    uVar78 = sVar53 * sVar37 + sVar90;
    uVar80 = sVar55 * sVar38 + sVar91;
    uVar82 = sVar58 * uVar67 + sVar92;
    uVar69 = uVar66 >> 8;
    uVar71 = uVar70 >> 8;
    uVar73 = uVar72 >> 8;
    uVar75 = uVar74 >> 8;
    uVar77 = uVar76 >> 8;
    uVar79 = uVar78 >> 8;
    uVar81 = uVar80 >> 8;
    uVar93 = uVar82 >> 8;
    uVar95 = sVar48 * uVar30 + sVar83;
    uVar99 = sVar49 * uVar94 + sVar86;
    uVar105 = sVar50 * uVar96 + sVar87;
    uVar113 = sVar51 * uVar98 + sVar88;
    uVar103 = sVar52 * uVar100 + sVar89;
    uVar107 = sVar53 * uVar102 + sVar90;
    uVar111 = sVar55 * uVar106 + sVar91;
    uVar115 = sVar58 * uVar110 + sVar92;
    uVar97 = uVar95 >> 8;
    uVar101 = uVar99 >> 8;
    uVar109 = uVar105 >> 8;
    uVar114 = uVar113 >> 8;
    uVar104 = uVar103 >> 8;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar116 = uVar115 >> 8;
    puVar26[-0x10] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar69);
    puVar26[-0xf] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
    puVar26[-0xe] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
    puVar26[-0xd] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar26[-0xc] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    puVar26[-0xb] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    puVar26[-10] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar26[-9] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar93);
    puVar26[-8] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar97);
    puVar26[-7] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar26[-6] = (uVar109 != 0) * (uVar109 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar109);
    puVar26[-5] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar26[-4] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar26[-3] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar26[-2] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar26[-1] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    uVar95 = sVar48 * uVar39 + sVar83;
    uVar99 = sVar49 * sVar40 + sVar86;
    uVar105 = sVar50 * sVar41 + sVar87;
    uVar113 = sVar51 * sVar42 + sVar88;
    uVar103 = sVar52 * sVar43 + sVar89;
    uVar107 = sVar53 * sVar44 + sVar90;
    uVar111 = sVar55 * sVar45 + sVar91;
    uVar115 = sVar58 * uVar54 + sVar92;
    uVar97 = uVar95 >> 8;
    uVar101 = uVar99 >> 8;
    uVar109 = uVar105 >> 8;
    uVar114 = uVar113 >> 8;
    uVar104 = uVar103 >> 8;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar116 = uVar115 >> 8;
    uVar66 = sVar48 * uVar31 + sVar83;
    uVar70 = sVar49 * uVar59 + sVar86;
    uVar72 = sVar50 * uVar60 + sVar87;
    uVar74 = sVar51 * uVar61 + sVar88;
    uVar76 = sVar52 * uVar62 + sVar89;
    uVar78 = sVar53 * uVar63 + sVar90;
    uVar80 = sVar55 * uVar64 + sVar91;
    uVar82 = sVar58 * uVar65 + sVar92;
    uVar69 = uVar66 >> 8;
    uVar71 = uVar70 >> 8;
    uVar73 = uVar72 >> 8;
    uVar75 = uVar74 >> 8;
    uVar77 = uVar76 >> 8;
    uVar79 = uVar78 >> 8;
    uVar81 = uVar80 >> 8;
    uVar93 = uVar82 >> 8;
    *puVar26 = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar97);
    puVar26[1] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar26[2] = (uVar109 != 0) * (uVar109 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar109);
    puVar26[3] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar26[4] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar26[5] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar26[6] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar26[7] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar26[8] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar69);
    puVar26[9] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
    puVar26[10] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
    puVar26[0xb] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar26[0xc] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    puVar26[0xd] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    puVar26[0xe] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar26[0xf] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar93);
    puVar26 = puVar26 + stride;
  }
  for (uVar25 = 0x1000100; auVar47 = _DAT_004689b0, uVar25 < 0xf0e0f0f; uVar25 = uVar25 + 0x2020202)
  {
    auVar85._4_4_ = uVar25;
    auVar85._0_4_ = uVar25;
    auVar85._8_4_ = uVar25;
    auVar85._12_4_ = uVar25;
    auVar47 = pshufb(auVar57,auVar85);
    auVar85 = pshufb(auVar28,auVar85);
    sVar48 = auVar47._0_2_;
    sVar49 = auVar47._2_2_;
    sVar50 = auVar47._4_2_;
    sVar51 = auVar47._6_2_;
    sVar52 = auVar47._8_2_;
    sVar53 = auVar47._10_2_;
    sVar55 = auVar47._12_2_;
    sVar58 = auVar47._14_2_;
    sVar83 = auVar85._0_2_ + 0x80;
    sVar86 = auVar85._2_2_ + 0x80;
    sVar87 = auVar85._4_2_ + 0x80;
    sVar88 = auVar85._6_2_ + 0x80;
    sVar89 = auVar85._8_2_ + 0x80;
    sVar90 = auVar85._10_2_ + 0x80;
    sVar91 = auVar85._12_2_ + 0x80;
    sVar92 = auVar85._14_2_ + 0x80;
    uVar66 = sVar48 * uVar32 + sVar83;
    uVar70 = sVar49 * sVar33 + sVar86;
    uVar72 = sVar50 * sVar34 + sVar87;
    uVar74 = sVar51 * sVar35 + sVar88;
    uVar76 = sVar52 * sVar36 + sVar89;
    uVar78 = sVar53 * sVar37 + sVar90;
    uVar80 = sVar55 * sVar38 + sVar91;
    uVar82 = sVar58 * uVar67 + sVar92;
    uVar69 = uVar66 >> 8;
    uVar71 = uVar70 >> 8;
    uVar73 = uVar72 >> 8;
    uVar75 = uVar74 >> 8;
    uVar77 = uVar76 >> 8;
    uVar79 = uVar78 >> 8;
    uVar81 = uVar80 >> 8;
    uVar93 = uVar82 >> 8;
    uVar95 = sVar48 * uVar30 + sVar83;
    uVar99 = sVar49 * uVar94 + sVar86;
    uVar105 = sVar50 * uVar96 + sVar87;
    uVar113 = sVar51 * uVar98 + sVar88;
    uVar103 = sVar52 * uVar100 + sVar89;
    uVar107 = sVar53 * uVar102 + sVar90;
    uVar111 = sVar55 * uVar106 + sVar91;
    uVar115 = sVar58 * uVar110 + sVar92;
    uVar97 = uVar95 >> 8;
    uVar101 = uVar99 >> 8;
    uVar109 = uVar105 >> 8;
    uVar114 = uVar113 >> 8;
    uVar104 = uVar103 >> 8;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar116 = uVar115 >> 8;
    puVar26[-0x10] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar69);
    puVar26[-0xf] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
    puVar26[-0xe] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
    puVar26[-0xd] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar26[-0xc] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    puVar26[-0xb] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    puVar26[-10] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar26[-9] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar93);
    puVar26[-8] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar97);
    puVar26[-7] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar26[-6] = (uVar109 != 0) * (uVar109 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar109);
    puVar26[-5] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar26[-4] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar26[-3] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar26[-2] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar26[-1] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    uVar95 = sVar48 * uVar39 + sVar83;
    uVar99 = sVar49 * sVar40 + sVar86;
    uVar105 = sVar50 * sVar41 + sVar87;
    uVar113 = sVar51 * sVar42 + sVar88;
    uVar103 = sVar52 * sVar43 + sVar89;
    uVar107 = sVar53 * sVar44 + sVar90;
    uVar111 = sVar55 * sVar45 + sVar91;
    uVar115 = sVar58 * uVar54 + sVar92;
    uVar97 = uVar95 >> 8;
    uVar101 = uVar99 >> 8;
    uVar109 = uVar105 >> 8;
    uVar114 = uVar113 >> 8;
    uVar104 = uVar103 >> 8;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar116 = uVar115 >> 8;
    uVar66 = sVar48 * uVar31 + sVar83;
    uVar70 = sVar49 * uVar59 + sVar86;
    uVar72 = sVar50 * uVar60 + sVar87;
    uVar74 = sVar51 * uVar61 + sVar88;
    uVar76 = sVar52 * uVar62 + sVar89;
    uVar78 = sVar53 * uVar63 + sVar90;
    uVar80 = sVar55 * uVar64 + sVar91;
    uVar82 = sVar58 * uVar65 + sVar92;
    uVar69 = uVar66 >> 8;
    uVar71 = uVar70 >> 8;
    uVar73 = uVar72 >> 8;
    uVar75 = uVar74 >> 8;
    uVar77 = uVar76 >> 8;
    uVar79 = uVar78 >> 8;
    uVar81 = uVar80 >> 8;
    uVar93 = uVar82 >> 8;
    *puVar26 = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar97);
    puVar26[1] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar26[2] = (uVar109 != 0) * (uVar109 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar109);
    puVar26[3] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar26[4] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar26[5] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar26[6] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar26[7] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar26[8] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar69);
    puVar26[9] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
    puVar26[10] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
    puVar26[0xb] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar26[0xc] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    puVar26[0xd] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    puVar26[0xe] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar26[0xf] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar93);
    puVar26 = puVar26 + stride;
  }
  auVar57._0_2_ = sVar27 * 0xeb;
  auVar57._2_2_ = sVar29 * 0xef;
  auVar57._4_2_ = sVar27 * 0xf2;
  auVar57._6_2_ = sVar29 * 0xf4;
  auVar57._8_2_ = sVar27 * 0xf6;
  auVar57._10_2_ = sVar29 * 0xf7;
  auVar57._12_2_ = sVar27 * 0xf8;
  auVar57._14_2_ = sVar29 * 0xf8;
  for (uVar25 = 0x1000100; uVar25 < 0xf0e0f0f; uVar25 = uVar25 + 0x2020202) {
    auVar56._4_4_ = uVar25;
    auVar56._0_4_ = uVar25;
    auVar56._8_4_ = uVar25;
    auVar56._12_4_ = uVar25;
    auVar85 = pshufb(auVar47,auVar56);
    auVar28 = pshufb(auVar57,auVar56);
    sVar27 = auVar85._0_2_;
    sVar29 = auVar85._2_2_;
    sVar48 = auVar85._4_2_;
    sVar49 = auVar85._6_2_;
    sVar50 = auVar85._8_2_;
    sVar51 = auVar85._10_2_;
    sVar52 = auVar85._12_2_;
    sVar53 = auVar85._14_2_;
    sVar55 = auVar28._0_2_ + 0x80;
    sVar58 = auVar28._2_2_ + 0x80;
    sVar83 = auVar28._4_2_ + 0x80;
    sVar86 = auVar28._6_2_ + 0x80;
    sVar87 = auVar28._8_2_ + 0x80;
    sVar88 = auVar28._10_2_ + 0x80;
    sVar89 = auVar28._12_2_ + 0x80;
    sVar90 = auVar28._14_2_ + 0x80;
    uVar66 = sVar27 * uVar32 + sVar55;
    uVar70 = sVar29 * sVar33 + sVar58;
    uVar72 = sVar48 * sVar34 + sVar83;
    uVar74 = sVar49 * sVar35 + sVar86;
    uVar76 = sVar50 * sVar36 + sVar87;
    uVar78 = sVar51 * sVar37 + sVar88;
    uVar80 = sVar52 * sVar38 + sVar89;
    uVar82 = sVar53 * uVar67 + sVar90;
    uVar69 = uVar66 >> 8;
    uVar71 = uVar70 >> 8;
    uVar73 = uVar72 >> 8;
    uVar75 = uVar74 >> 8;
    uVar77 = uVar76 >> 8;
    uVar79 = uVar78 >> 8;
    uVar81 = uVar80 >> 8;
    uVar93 = uVar82 >> 8;
    uVar95 = sVar27 * uVar30 + sVar55;
    uVar99 = sVar29 * uVar94 + sVar58;
    uVar105 = sVar48 * uVar96 + sVar83;
    uVar113 = sVar49 * uVar98 + sVar86;
    uVar103 = sVar50 * uVar100 + sVar87;
    uVar107 = sVar51 * uVar102 + sVar88;
    uVar111 = sVar52 * uVar106 + sVar89;
    uVar115 = sVar53 * uVar110 + sVar90;
    uVar97 = uVar95 >> 8;
    uVar101 = uVar99 >> 8;
    uVar109 = uVar105 >> 8;
    uVar114 = uVar113 >> 8;
    uVar104 = uVar103 >> 8;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar116 = uVar115 >> 8;
    puVar26[-0x10] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar69);
    puVar26[-0xf] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
    puVar26[-0xe] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
    puVar26[-0xd] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar26[-0xc] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    puVar26[-0xb] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    puVar26[-10] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar26[-9] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar93);
    puVar26[-8] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar97);
    puVar26[-7] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar26[-6] = (uVar109 != 0) * (uVar109 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar109);
    puVar26[-5] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar26[-4] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar26[-3] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar26[-2] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar26[-1] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    uVar95 = sVar27 * uVar39 + sVar55;
    uVar99 = sVar29 * sVar40 + sVar58;
    uVar105 = sVar48 * sVar41 + sVar83;
    uVar113 = sVar49 * sVar42 + sVar86;
    uVar103 = sVar50 * sVar43 + sVar87;
    uVar107 = sVar51 * sVar44 + sVar88;
    uVar111 = sVar52 * sVar45 + sVar89;
    uVar115 = sVar53 * uVar54 + sVar90;
    uVar97 = uVar95 >> 8;
    uVar101 = uVar99 >> 8;
    uVar109 = uVar105 >> 8;
    uVar114 = uVar113 >> 8;
    uVar104 = uVar103 >> 8;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar116 = uVar115 >> 8;
    uVar66 = sVar27 * uVar31 + sVar55;
    uVar70 = sVar29 * uVar59 + sVar58;
    uVar72 = sVar48 * uVar60 + sVar83;
    uVar74 = sVar49 * uVar61 + sVar86;
    uVar76 = sVar50 * uVar62 + sVar87;
    uVar78 = sVar51 * uVar63 + sVar88;
    uVar80 = sVar52 * uVar64 + sVar89;
    uVar82 = sVar53 * uVar65 + sVar90;
    uVar69 = uVar66 >> 8;
    uVar71 = uVar70 >> 8;
    uVar73 = uVar72 >> 8;
    uVar75 = uVar74 >> 8;
    uVar77 = uVar76 >> 8;
    uVar79 = uVar78 >> 8;
    uVar81 = uVar80 >> 8;
    uVar93 = uVar82 >> 8;
    *puVar26 = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar97);
    puVar26[1] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar26[2] = (uVar109 != 0) * (uVar109 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar109);
    puVar26[3] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar26[4] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar26[5] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar26[6] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar26[7] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar26[8] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar69);
    puVar26[9] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
    puVar26[10] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
    puVar26[0xb] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar26[0xc] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    puVar26[0xd] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    puVar26[0xe] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar26[0xf] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar93);
    puVar26 = puVar26 + stride;
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_32x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[31]);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i zero = _mm_setzero_si128();
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i top_lo = LoadUnaligned16(top_row);
  const __m128i top_hi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lo, zero);
  const __m128i top3 = cvtepu8_epi16(top_hi);
  const __m128i top4 = _mm_unpackhi_epi8(top_hi, zero);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = _mm_unpackhi_epi8(weights_lo, zero);
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = _mm_unpackhi_epi8(weights_hi, zero);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i scaled_bottom_left3 =
      _mm_mullo_epi16(inverted_weights3, bottom_left);
  const __m128i scaled_bottom_left4 =
      _mm_mullo_epi16(inverted_weights4, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights3, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left3, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights4, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left4, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}